

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-cpuid.c
# Opt level: O2

void cpuid_get_family_model(uint32_t *family,uint32_t *model)

{
  uint *puVar1;
  uint uVar2;
  char *__assertion;
  
  if (family == (uint32_t *)0x0) {
    __assertion = "family != NULL";
    uVar2 = 0x30;
  }
  else {
    if (model != (uint32_t *)0x0) {
      puVar1 = (uint *)cpuid_Version_info(1);
      uVar2 = *puVar1;
      *family = uVar2 >> 0x10 & 0xf0 | uVar2 >> 8 & 0xf;
      *model = uVar2 >> 0xc & 0xf0 | uVar2 >> 4 & 0xf;
      return;
    }
    __assertion = "model != NULL";
    uVar2 = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-cpuid.c"
                ,uVar2,"void cpuid_get_family_model(uint32_t *, uint32_t *)");
}

Assistant:

void cpuid_get_family_model(uint32_t* family, uint32_t* model) {
  assert(family != NULL);
  assert(model != NULL);
  asm_cpuid_data cpudata;
  asm_cpuid(1, &cpudata);
  // family | extended family (upper 4 bits only) -- must be "6"
  *family = ((cpudata.eax >> 8) & 0xF) | ((cpudata.eax >> 16) & 0xF0);
  // model | processor type (plus two more bits 14:15?)
  *model = ((cpudata.eax >> 4) & 0xF) | ((cpudata.eax >> 12) & 0xF0);
  raplcap_log(DEBUG, "cpuid_get_family_model: cpu_family=%02X, cpu_model=%02X\n", *family, *model);
}